

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::MergeReturnPass::GenerateState(MergeReturnPass *this,BasicBlock *block)

{
  Instruction *pIVar1;
  Instruction *pIVar2;
  Instruction **__args;
  Instruction *mergeInst;
  Instruction *lastMergeInst;
  Instruction *local_18;
  Instruction *local_10;
  
  __args = &local_18;
  local_18 = BasicBlock::GetMergeInst(block);
  if (local_18 != (Instruction *)0x0) {
    if (local_18->opcode_ != OpLoopMerge) {
      pIVar1 = (local_18->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      pIVar2 = (Instruction *)0x0;
      if ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false) {
        pIVar2 = pIVar1;
      }
      if (pIVar2->opcode_ == OpSwitch) {
        local_10 = (this->state_).
                   super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].break_merge_;
        __args = &local_18;
        if ((local_10 != (Instruction *)0x0) &&
           (__args = &local_18, local_10->opcode_ == OpLoopMerge)) {
          __args = &local_10;
        }
      }
      else {
        local_10 = (this->state_).
                   super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].break_merge_;
        __args = &local_10;
      }
    }
    std::
    vector<spvtools::opt::MergeReturnPass::StructuredControlState,std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>>
    ::emplace_back<spvtools::opt::Instruction*&,spvtools::opt::Instruction*&>
              ((vector<spvtools::opt::MergeReturnPass::StructuredControlState,std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>>
                *)&this->state_,__args,&local_18);
  }
  return;
}

Assistant:

void MergeReturnPass::GenerateState(BasicBlock* block) {
  if (Instruction* mergeInst = block->GetMergeInst()) {
    if (mergeInst->opcode() == spv::Op::OpLoopMerge) {
      // If new loop, break to this loop merge block
      state_.emplace_back(mergeInst, mergeInst);
    } else {
      auto branchInst = mergeInst->NextNode();
      if (branchInst->opcode() == spv::Op::OpSwitch) {
        // If switch inside of loop, break to innermost loop merge block.
        // Otherwise need to break to this switch merge block.
        auto lastMergeInst = state_.back().BreakMergeInst();
        if (lastMergeInst && lastMergeInst->opcode() == spv::Op::OpLoopMerge)
          state_.emplace_back(lastMergeInst, mergeInst);
        else
          state_.emplace_back(mergeInst, mergeInst);
      } else {
        // If branch conditional inside loop, always break to innermost
        // loop merge block. If branch conditional inside switch, break to
        // innermost switch merge block.
        auto lastMergeInst = state_.back().BreakMergeInst();
        state_.emplace_back(lastMergeInst, mergeInst);
      }
    }
  }
}